

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_print.c
# Opt level: O0

void fprint_xml_esc(FILE *file,char *str)

{
  char cVar1;
  char *pcStack_18;
  char next;
  char *str_local;
  FILE *file_local;
  
  for (pcStack_18 = str; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
    cVar1 = *pcStack_18;
    if ((((cVar1 == '\"') || (cVar1 == '\'')) || (cVar1 == '<')) ||
       ((cVar1 == '>' || (cVar1 == '&')))) {
      switch(cVar1) {
      case '\"':
        fputs("&quot;",(FILE *)file);
        break;
      default:
        break;
      case '&':
        fputs("&amp;",(FILE *)file);
        break;
      case '\'':
        fputs("&apos;",(FILE *)file);
        break;
      case '<':
        fputs("&lt;",(FILE *)file);
        break;
      case '>':
        fputs("&gt;",(FILE *)file);
      }
    }
    else if ((cVar1 < ' ') || ('~' < cVar1)) {
      if ((((cVar1 == '\t') || (cVar1 == '\n')) || (cVar1 == '\r')) || ('\x1f' < cVar1)) {
        fprintf((FILE *)file,"&#x%X;",(ulong)(uint)(int)cVar1);
      }
    }
    else {
      fputc((int)cVar1,(FILE *)file);
    }
  }
  return;
}

Assistant:

void fprint_xml_esc(FILE * file, const char *str)
{
    /* The valid XML characters are as follows:
     *   #x9 | #xA | #xD | [#x20-#xD7FF] | [#xE000-#xFFFD] | [#x10000-#x10FFFF]
     * Characters that are outside of ASCII must be encoded. Further, the
     * following special characters:
     *   " ' < > &
     * must be encoded. We assume that the incoming string may be a multibyte
     * character.
     */

    for(; *str != '\0'; str++)
    {
        char next = *str;

        /* handle special characters that must be escaped */
        if(next == '"' || next == '\'' || next == '<' || next == '>' || next == '&')
        {
            switch (next)
            {
                case '"':
                    fputs("&quot;", file);
                    break;
                case '\'':
                    fputs("&apos;", file);
                    break;
                case '<':
                    fputs("&lt;", file);
                    break;
                case '>':
                    fputs("&gt;", file);
                    break;
                case '&':
                    fputs("&amp;", file);
                    break;
                default:
                    /* Program cannot reach here */
                    break;
            }
        }
        /* printable ASCII */
        else if(next >= ' ' && next <= '~')
        {
            fputc(next, file);
        }
        /* Non-printable character */
        else if(next == 0x9 || next == 0xA || next == 0xD ||
                next >= 0x20)
        {
            fprintf(file, "&#x%X;", next);
        }
        /* If it did not get printed, it is not a valid XML character*/
    }
}